

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 float32_to_floatx80_mips(float32 a,float_status *status)

{
  floatx80 fVar1;
  int iVar2;
  commonNaNT a_00;
  float32 a_01;
  uint uVar3;
  uint uVar4;
  floatx80 fVar5;
  commonNaNT local_28;
  
  a_01 = float32_squash_input_denormal_mips(a,status);
  uVar3 = a_01 & 0x7fffff;
  iVar2 = (int)a_01 >> 0x1f;
  if ((char)(a_01 >> 0x17) == '\0') {
    if (uVar3 == 0) {
      return (floatx80)(ZEXT416((uint)(iVar2 * -0x8000)) << 0x40);
    }
    uVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar3 = uVar3 << ((char)(uVar4 ^ 0x1f) - 8U & 0x1f);
    uVar4 = 9 - (uVar4 ^ 0x1f);
  }
  else {
    uVar4 = a_01 >> 0x17 & 0xff;
    if (uVar4 == 0xff) {
      if (uVar3 != 0) {
        float32ToCommonNaN(&local_28,a_01,status);
        a_00.high = local_28.high;
        a_00.sign = local_28.sign;
        a_00._1_7_ = local_28._1_7_;
        a_00.low = local_28.low;
        fVar5 = commonNaNToFloatx80(a_00,status);
        return fVar5;
      }
      fVar5._8_4_ = iVar2 * -0x8000 | 0x7fff;
      fVar5.low = 0x8000000000000000;
      fVar5._12_4_ = 0;
      return fVar5;
    }
  }
  fVar1._8_4_ = iVar2 * -0x8000 + uVar4 + 0x3f80;
  fVar1.low = (ulong)(uVar3 | 0x800000) << 0x28;
  fVar1._12_4_ = 0;
  return fVar1;
}

Assistant:

floatx80 float32_to_floatx80(float32 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint32_t aSig;

    a = float32_squash_input_denormal(a, status);
    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );
    if ( aExp == 0xFF ) {
        if (aSig) {
            return commonNaNToFloatx80(float32ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign,
                            floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat32Subnormal( aSig, &aExp, &aSig );
    }
    aSig |= 0x00800000;
    return packFloatx80( aSign, aExp + 0x3F80, ( (uint64_t) aSig )<<40 );

}